

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

String * __thiscall Lexer::describeCurrentPosition(String *__return_storage_ptr__,Lexer *this)

{
  TokenInfo *pTVar1;
  String local_38;
  Lexer *local_18;
  Lexer *this_local;
  
  local_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  pTVar1 = token(this);
  String::operator+(&local_38,&pTVar1->file,":");
  pTVar1 = token(this);
  String::operator+(__return_storage_ptr__,&local_38,pTVar1->line);
  String::~String(&local_38);
  return __return_storage_ptr__;
}

Assistant:

String Lexer::describeCurrentPosition()
{
	return token()->file + ":" + token()->line;
}